

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::cmCTestRunTest(cmCTestRunTest *this,cmCTestTestHandler *handler)

{
  cmCTestTestHandler *handler_local;
  cmCTestRunTest *this_local;
  
  std::__cxx11::string::string((string *)&this->PrefixCommand);
  std::__cxx11::string::string((string *)&this->ProcessOutput);
  std::__cxx11::string::string((string *)&this->CompressedOutput);
  cmCTestTestHandler::cmCTestTestResult::cmCTestTestResult(&this->TestResult);
  std::__cxx11::string::string((string *)&this->StartTime);
  std::__cxx11::string::string((string *)&this->ActualCommand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Arguments);
  this->CTest = (handler->super_cmCTestGenericHandler).CTest;
  this->TestHandler = handler;
  this->TestProcess = (cmProcess *)0x0;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).ReturnValue = 0;
  (this->TestResult).Status = 0;
  (this->TestResult).TestCount = 0;
  (this->TestResult).Properties = (cmCTestTestProperties *)0x0;
  std::__cxx11::string::operator=((string *)&this->ProcessOutput,"");
  std::__cxx11::string::operator=((string *)&this->CompressedOutput,"");
  this->CompressionRatio = 2.0;
  this->StopTimePassed = false;
  this->NumberOfRunsLeft = 1;
  this->RunUntilFail = false;
  this->RunAgain = false;
  return;
}

Assistant:

cmCTestRunTest::cmCTestRunTest(cmCTestTestHandler* handler)
{
  this->CTest = handler->CTest;
  this->TestHandler = handler;
  this->TestProcess = 0;
  this->TestResult.ExecutionTime =0;
  this->TestResult.ReturnValue = 0;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = 0;
  this->TestResult.Properties = 0;
  this->ProcessOutput = "";
  this->CompressedOutput = "";
  this->CompressionRatio = 2;
  this->StopTimePassed = false;
  this->NumberOfRunsLeft = 1; // default to 1 run of the test
  this->RunUntilFail = false; // default to run the test once
  this->RunAgain = false;   // default to not having to run again
}